

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  int iVar1;
  double *attribute;
  long in_RSI;
  undefined8 in_RDI;
  undefined1 uVar2;
  StringRef SVar3;
  ScopedElement e;
  SectionStats *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ScopedElement *this_00;
  undefined4 uVar4;
  XmlFormatting fmt;
  string *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  XmlFormatting in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 in_stack_ffffffffffffff68 [16];
  undefined1 local_41 [49];
  long local_10;
  
  uVar4 = (undefined4)in_RDI;
  fmt = (XmlFormatting)((ulong)in_RDI >> 0x20);
  local_10 = in_RSI;
  StreamingReporterBase::sectionEnded
            ((StreamingReporterBase *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  iVar1 = *(int *)(CONCAT44(fmt,uVar4) + 0xe0) + -1;
  *(int *)(CONCAT44(fmt,uVar4) + 0xe0) = iVar1;
  if (0 < iVar1) {
    attribute = (double *)(CONCAT44(fmt,uVar4) + 0x98);
    this_00 = (ScopedElement *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              ((XmlWriter *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50,fmt);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
    operator____sr((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (size_t)in_stack_ffffffffffffff28);
    SVar3.m_start._4_4_ = fmt;
    SVar3.m_start._0_4_ = uVar4;
    SVar3.m_size = (size_type)in_stack_ffffffffffffff50;
    XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
              (this_00,SVar3,(unsigned_long *)attribute);
    operator____sr((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (size_t)in_stack_ffffffffffffff28);
    name.m_start._4_4_ = fmt;
    name.m_start._0_4_ = uVar4;
    name.m_size = (size_type)in_stack_ffffffffffffff50;
    XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
              (this_00,name,(unsigned_long *)attribute);
    operator____sr((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (size_t)in_stack_ffffffffffffff28);
    name_00.m_start._4_4_ = fmt;
    name_00.m_start._0_4_ = uVar4;
    name_00.m_size = (size_type)in_stack_ffffffffffffff50;
    XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
              (this_00,name_00,(unsigned_long *)attribute);
    operator____sr((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (size_t)in_stack_ffffffffffffff28);
    uVar2 = *(long *)(local_10 + 0x48) != 0;
    name_01.m_start._4_4_ = fmt;
    name_01.m_start._0_4_ = uVar4;
    name_01.m_size = (size_type)in_stack_ffffffffffffff50;
    XmlWriter::ScopedElement::writeAttribute<bool,void>(this_00,name_01,(bool *)attribute);
    iVar1 = (**(code **)(**(long **)(CONCAT44(fmt,uVar4) + 0x10) + 0x58))();
    if (iVar1 == 1) {
      SVar3 = operator____sr((char *)CONCAT44(1,in_stack_ffffffffffffff30),
                             (size_t)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff5c = SVar3.m_size._4_4_;
      name_02.m_start._4_4_ = fmt;
      name_02.m_start._0_4_ = uVar4;
      name_02.m_size = (size_type)SVar3.m_start;
      XmlWriter::ScopedElement::writeAttribute<double,void>(this_00,name_02,attribute);
    }
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(iVar1,in_stack_ffffffffffffff30));
    operator|(Newline,Indent);
    XmlWriter::endElement
              ((XmlWriter *)CONCAT17(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if ( --m_sectionDepth > 0 ) {
            {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes"_sr, sectionStats.assertions.passed );
                e.writeAttribute( "failures"_sr, sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures"_sr, sectionStats.assertions.failedButOk );
                e.writeAttribute( "skipped"_sr, sectionStats.assertions.skipped > 0 );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds"_sr, sectionStats.durationInSeconds );
            }
            // Ends assertion tag
            m_xml.endElement();
        }
    }